

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

bool __thiscall LiteScript::Character::operator>(Character *this,String *str)

{
  bool bVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_30;
  
  String::String((String *)&local_30,(this->str->str)._M_dataplus._M_p[this->i]);
  bVar1 = std::operator>(&local_30,&str->str);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  return bVar1;
}

Assistant:

bool LiteScript::Character::operator>(const LiteScript::String& str) const {
    return (String(this->str[i]) > str);
}